

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

uint strpool_internal_find_in_blocks(strpool_t *pool,char *string,int length)

{
  strpool_internal_block_t *psVar1;
  uint hash;
  int stored_length;
  uint *ptr;
  strpool_internal_block_t *block;
  int i;
  int length_local;
  char *string_local;
  strpool_t *pool_local;
  
  block._0_4_ = 0;
  while( true ) {
    if (pool->block_count <= (int)block) {
      return 0;
    }
    psVar1 = pool->blocks + (int)block;
    if ((psVar1->data + 8 <= string) && (string < psVar1->data + psVar1->capacity)) break;
    block._0_4_ = (int)block + 1;
  }
  if ((*(int *)(string + -4) == length) && (string[length] == '\0')) {
    return *(uint *)(string + -8);
  }
  return 0;
}

Assistant:

static STRPOOL_U32 strpool_internal_find_in_blocks( strpool_t const* pool, char const* string, int length )
    {
    for( int i = 0; i < pool->block_count; ++i )
        {
        strpool_internal_block_t* block = &pool->blocks[ i ];
        // Check if string comes from pool
        if( string >= block->data + 2 * sizeof( STRPOOL_U32 ) && string < block->data + block->capacity ) 
            {
            STRPOOL_U32* ptr = (STRPOOL_U32*) string;
            int stored_length = (int)( *( ptr - 1 ) ); // Length is stored immediately before string
            if( stored_length != length || string[ length ] != '\0' ) return 0; // Invalid string
            STRPOOL_U32 hash = *( ptr - 2 ); // Hash is stored before the length field
            return hash;
            }
        }

    return 0;
    }